

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExporter.cpp
# Opt level: O0

int __thiscall iDynTree::ModelExporter::init(ModelExporter *this,EVP_PKEY_CTX *ctx)

{
  undefined1 uVar1;
  int iVar2;
  SensorsList *this_00;
  undefined8 uVar3;
  ModelExporterOptions *in_RDX;
  Model modelCopy;
  undefined7 in_stack_fffffffffffffe10;
  ModelExporterOptions *this_01;
  ModelExporterOptions local_150 [3];
  ModelExporterOptions *local_18;
  EVP_PKEY_CTX *local_10;
  ModelExporter *local_8;
  
  this_01 = local_150;
  local_18 = in_RDX;
  local_10 = ctx;
  local_8 = this;
  iDynTree::Model::Model((Model *)this_01,(Model *)ctx);
  this_00 = (SensorsList *)iDynTree::Model::sensors();
  iDynTree::SensorsList::operator=(this_00,(SensorsList *)local_18);
  ModelExporterOptions::ModelExporterOptions(local_18,this_01);
  iVar2 = init(this,(EVP_PKEY_CTX *)local_150);
  uVar1 = (undefined1)iVar2;
  ModelExporterOptions::~ModelExporterOptions
            ((ModelExporterOptions *)CONCAT17(uVar1,in_stack_fffffffffffffe10));
  uVar3 = iDynTree::Model::~Model((Model *)local_150);
  return (uint)CONCAT71((int7)((ulong)uVar3 >> 8),uVar1) & 0xffffff01;
}

Assistant:

bool ModelExporter::init(const Model& model,
                         const SensorsList& sensors,
                         const ModelExporterOptions options)
{
    Model modelCopy = model;
    modelCopy.sensors() = sensors;
    return init(modelCopy, options);
}